

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  char *__format;
  int num2;
  int num1;
  uint local_20;
  uint local_1c;
  
  printf("Enter a dividend: ");
  __isoc99_scanf("%i",&local_1c);
  printf("Enter a divisor: ");
  __isoc99_scanf("%i",&local_20);
  __format = "%i is NOT evenly divisible by %i\n";
  if ((int)local_1c % (int)local_20 == 0) {
    __format = "%i is evenly divisible by %i\n";
  }
  printf(__format,(ulong)local_1c,(ulong)local_20);
  return 0;
}

Assistant:

int main() {

    int num1, num2;

    printf("Enter a dividend: ");
    scanf("%i", &num1);

    printf("Enter a divisor: ");
    scanf("%i", &num2);

    if (num1 % num2 == 0) {
        printf("%i is evenly divisible by %i\n", num1, num2);
    } else {
        printf("%i is NOT evenly divisible by %i\n", num1, num2);
    }

    return 0;
}